

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

uint Extra_TruthCanonNP(uint uTruth,int nVars)

{
  uint Truth;
  uint uVar1;
  int local_28;
  int local_24;
  int i;
  int k;
  int nMints;
  uint uPerm;
  uint uPhase;
  uint uTruthMin;
  int nVars_local;
  uint uTruth_local;
  
  if (Extra_TruthCanonNP::pPerms == (char **)0x0) {
    Extra_TruthCanonNP::nPerms = Extra_Factorial(nVars);
    Extra_TruthCanonNP::pPerms = Extra_Permutations(nVars);
    Extra_TruthCanonNP::nVarsOld = nVars;
  }
  else if (Extra_TruthCanonNP::nVarsOld != nVars) {
    if (Extra_TruthCanonNP::pPerms != (char **)0x0) {
      free(Extra_TruthCanonNP::pPerms);
      Extra_TruthCanonNP::pPerms = (char **)0x0;
    }
    Extra_TruthCanonNP::nPerms = Extra_Factorial(nVars);
    Extra_TruthCanonNP::pPerms = Extra_Permutations(nVars);
    Extra_TruthCanonNP::nVarsOld = nVars;
  }
  uPerm = 0xffffffff;
  for (local_28 = 0; local_28 < 1 << ((byte)nVars & 0x1f); local_28 = local_28 + 1) {
    Truth = Extra_TruthPolarize(uTruth,local_28,nVars);
    for (local_24 = 0; local_24 < Extra_TruthCanonNP::nPerms; local_24 = local_24 + 1) {
      uVar1 = Extra_TruthPermute(Truth,Extra_TruthCanonNP::pPerms[local_24],nVars,0);
      if (uVar1 < uPerm) {
        uPerm = uVar1;
      }
    }
  }
  return uPerm;
}

Assistant:

unsigned Extra_TruthCanonNP( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}